

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase195::run(TestCase195 *this)

{
  byte *pbVar1;
  uint local_178;
  ListElementCount local_174;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  Builder root;
  Reader reader;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  reader.reader._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>(&orphan,(Orphanage *)&reader,2);
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
            ((Builder *)&reader,&orphan.builder);
  reader.reader.ptr[0] = '{';
  reader.reader.ptr[1] = '\0';
  reader.reader.ptr[2] = '\0';
  reader.reader.ptr[3] = '\0';
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
            ((Builder *)&reader,&orphan.builder);
  pbVar1 = reader.reader.ptr + (reader.reader.step >> 3);
  pbVar1[0] = 200;
  pbVar1[1] = '\x01';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            (&reader,&orphan.builder);
  if (reader.reader.elementCount == 2) {
    if (kj::_::Debug::minSeverity < 3 && *(uint *)reader.reader.ptr != 0x7b) {
      root._builder.segment._0_4_ = 0x7b;
      local_178 = *(uint *)reader.reader.ptr;
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xcc,ERROR,"\"failed: expected \" \"(123u) == (reader[0])\", 123u, reader[0]",
                 (char (*) [39])"failed: expected (123u) == (reader[0])",(uint *)&root,&local_178);
    }
    if ((*(uint *)(reader.reader.ptr + (reader.reader.step >> 3)) != 0x1c8) &&
       (kj::_::Debug::minSeverity < 3)) {
      root._builder.segment._0_4_ = 0x1c8;
      local_178 = *(uint *)(reader.reader.ptr + (reader.reader.step >> 3));
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xcd,ERROR,"\"failed: expected \" \"(456u) == (reader[1])\", 456u, reader[1]",
                 (char (*) [39])"failed: expected (456u) == (reader[1])",(uint *)&root,&local_178);
    }
    MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
              (&root,&builder.super_MessageBuilder);
    capnproto_test::capnp::test::TestAllTypes::Builder::adoptUInt32List(&root,&orphan);
    OrphanBuilder::~OrphanBuilder(&orphan.builder);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_178 = 2;
  local_174 = reader.reader.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&root,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xcb,FAILED,"(2u) == (reader.size())","2u, reader.size()",&local_178,&local_174);
  kj::_::Debug::Fault::fatal((Fault *)&root);
}

Assistant:

TEST(Orphans, OrphanageList) {
  MallocMessageBuilder builder;

  Orphan<List<uint32_t>> orphan = builder.getOrphanage().newOrphan<List<uint32_t>>(2);
  orphan.get().set(0, 123);
  orphan.get().set(1, 456);

  List<uint32_t>::Reader reader = orphan.getReader();
  ASSERT_EQ(2u, reader.size());
  EXPECT_EQ(123u, reader[0]);
  EXPECT_EQ(456u, reader[1]);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptUInt32List(kj::mv(orphan));
}